

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O3

string * __thiscall
duckdb::AggregateStateType::GetTypeName_abi_cxx11_
          (string *__return_storage_ptr__,AggregateStateType *this,LogicalType *type)

{
  undefined8 *puVar1;
  string *psVar2;
  LogicalType *this_00;
  optional_ptr<duckdb::ExtraTypeInfo,_true> oVar3;
  long *plVar4;
  char *pcVar5;
  const_reference pvVar6;
  undefined8 *puVar7;
  ulong *puVar8;
  long *plVar9;
  size_type *psVar10;
  ulong uVar11;
  undefined8 uVar12;
  size_type __n;
  long lVar13;
  aggregate_state_t aggr_state;
  optional_ptr<duckdb::ExtraTypeInfo,_true> info;
  string local_1d0;
  undefined1 *local_1b0;
  long local_1a8;
  undefined1 local_1a0;
  undefined7 uStack_19f;
  ulong *local_190;
  long local_188;
  ulong local_180;
  long lStack_178;
  string *local_170;
  undefined8 *local_168;
  undefined8 local_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 *local_148;
  undefined8 local_140;
  undefined8 local_138;
  undefined8 uStack_130;
  ulong *local_128;
  long local_120;
  ulong local_118;
  long lStack_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  LogicalType local_e8;
  vector<duckdb::LogicalType,_true> local_d0;
  optional_ptr<duckdb::ExtraTypeInfo,_true> local_b8;
  undefined2 *local_b0;
  undefined8 local_a8;
  undefined2 local_a0;
  undefined1 local_9e;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  local_b8.ptr = *(ExtraTypeInfo **)(this + 8);
  if (local_b8.ptr == (ExtraTypeInfo *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    local_108._M_dataplus._M_p = (pointer)0x12;
    pcVar5 = (char *)::std::__cxx11::string::_M_create
                               ((ulong *)__return_storage_ptr__,(ulong)&local_108);
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = (size_type)local_108._M_dataplus._M_p;
    builtin_strncpy(pcVar5,"AGGREGATE_STATE<?>",0x12);
    __return_storage_ptr__->_M_string_length = (size_type)local_108._M_dataplus._M_p;
    local_108._M_dataplus._M_p[(long)(__return_storage_ptr__->_M_dataplus)._M_p] = '\0';
    return __return_storage_ptr__;
  }
  optional_ptr<duckdb::ExtraTypeInfo,_true>::CheckValid(&local_b8);
  oVar3.ptr = local_b8.ptr;
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_108,local_b8.ptr[1]._vptr_ExtraTypeInfo,
             *(long *)&local_b8.ptr[1].type + (long)local_b8.ptr[1]._vptr_ExtraTypeInfo);
  LogicalType::LogicalType(&local_e8,(LogicalType *)&oVar3.ptr[1].alias.field_2);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_d0,
             (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)(oVar3.ptr + 2));
  ::std::operator+(&local_70,"AGGREGATE_STATE<",&local_108);
  plVar4 = (long *)::std::__cxx11::string::append((char *)&local_70);
  local_190 = &local_180;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_180 = *puVar8;
    lStack_178 = plVar4[3];
  }
  else {
    local_180 = *puVar8;
    local_190 = (ulong *)*plVar4;
  }
  local_188 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_b0 = &local_a0;
  local_a0 = 0x202c;
  local_a8 = 2;
  local_9e = 0;
  local_1b0 = &local_1a0;
  local_1a8 = 0;
  local_1a0 = 0;
  lVar13 = (long)local_d0.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)local_d0.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  if (lVar13 != 0) {
    pvVar6 = vector<duckdb::LogicalType,_true>::operator[](&local_d0,0);
    LogicalType::ToString_abi_cxx11_(&local_1d0,pvVar6);
    ::std::__cxx11::string::_M_append((char *)&local_1b0,(ulong)local_1d0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p);
    }
  }
  uVar11 = (lVar13 >> 3) * -0x5555555555555555;
  local_170 = __return_storage_ptr__;
  if (1 < uVar11) {
    __n = 1;
    do {
      pvVar6 = vector<duckdb::LogicalType,_true>::operator[](&local_d0,__n);
      LogicalType::ToString_abi_cxx11_(&local_50,pvVar6);
      plVar4 = (long *)::std::__cxx11::string::replace
                                 ((ulong)&local_50,0,(char *)0x0,(ulong)local_b0);
      puVar8 = (ulong *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_1d0.field_2._M_allocated_capacity = *puVar8;
        local_1d0.field_2._8_8_ = plVar4[3];
        local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      }
      else {
        local_1d0.field_2._M_allocated_capacity = *puVar8;
        local_1d0._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_1d0._M_string_length = plVar4[1];
      *plVar4 = (long)puVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      ::std::__cxx11::string::_M_append((char *)&local_1b0,(ulong)local_1d0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      __n = __n + 1;
    } while (uVar11 - __n != 0);
  }
  psVar2 = local_170;
  uVar11 = 0xf;
  if (local_190 != &local_180) {
    uVar11 = local_180;
  }
  if (uVar11 < (ulong)(local_1a8 + local_188)) {
    uVar11 = 0xf;
    if (local_1b0 != &local_1a0) {
      uVar11 = CONCAT71(uStack_19f,local_1a0);
    }
    if (uVar11 < (ulong)(local_1a8 + local_188)) goto LAB_013f8f32;
    puVar7 = (undefined8 *)
             ::std::__cxx11::string::replace((ulong)&local_1b0,0,(char *)0x0,(ulong)local_190);
  }
  else {
LAB_013f8f32:
    puVar7 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_190,(ulong)local_1b0);
  }
  local_168 = &local_158;
  puVar1 = puVar7 + 2;
  if ((undefined8 *)*puVar7 == puVar1) {
    local_158 = *puVar1;
    uStack_150 = puVar7[3];
  }
  else {
    local_158 = *puVar1;
    local_168 = (undefined8 *)*puVar7;
  }
  local_160 = puVar7[1];
  *puVar7 = puVar1;
  puVar7[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar4 = (long *)::std::__cxx11::string::append((char *)&local_168);
  plVar9 = plVar4 + 2;
  if ((long *)*plVar4 == plVar9) {
    local_80 = *plVar9;
    lStack_78 = plVar4[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar9;
    local_90 = (long *)*plVar4;
  }
  local_88 = plVar4[1];
  *plVar4 = (long)plVar9;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)::std::__cxx11::string::append((char *)&local_90);
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_118 = *puVar8;
    lStack_110 = plVar4[3];
    local_128 = &local_118;
  }
  else {
    local_118 = *puVar8;
    local_128 = (ulong *)*plVar4;
  }
  local_120 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  LogicalType::ToString_abi_cxx11_(&local_1d0,&local_e8);
  uVar11 = 0xf;
  if (local_128 != &local_118) {
    uVar11 = local_118;
  }
  if (uVar11 < local_1d0._M_string_length + local_120) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      uVar12 = local_1d0.field_2._M_allocated_capacity;
    }
    if (local_1d0._M_string_length + local_120 <= (ulong)uVar12) {
      puVar7 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_1d0,0,(char *)0x0,(ulong)local_128);
      goto LAB_013f90dd;
    }
  }
  puVar7 = (undefined8 *)
           ::std::__cxx11::string::_M_append((char *)&local_128,(ulong)local_1d0._M_dataplus._M_p);
LAB_013f90dd:
  local_148 = &local_138;
  puVar1 = puVar7 + 2;
  if ((undefined8 *)*puVar7 == puVar1) {
    local_138 = *puVar1;
    uStack_130 = puVar7[3];
  }
  else {
    local_138 = *puVar1;
    local_148 = (undefined8 *)*puVar7;
  }
  local_140 = puVar7[1];
  *puVar7 = puVar1;
  puVar7[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar4 = (long *)::std::__cxx11::string::append((char *)&local_148);
  (psVar2->_M_dataplus)._M_p = (pointer)&psVar2->field_2;
  psVar10 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar10) {
    lVar13 = plVar4[3];
    (psVar2->field_2)._M_allocated_capacity = *psVar10;
    *(long *)((long)&psVar2->field_2 + 8) = lVar13;
  }
  else {
    (psVar2->_M_dataplus)._M_p = (pointer)*plVar4;
    (psVar2->field_2)._M_allocated_capacity = *psVar10;
  }
  psVar2->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar10;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_148 != &local_138) {
    operator_delete(local_148);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  if (local_128 != &local_118) {
    operator_delete(local_128);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (local_168 != &local_158) {
    operator_delete(local_168);
  }
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if (local_190 != &local_180) {
    operator_delete(local_190);
  }
  psVar2 = local_170;
  this_00 = local_d0.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
    psVar2 = local_170;
    this_00 = local_d0.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  for (; local_170 = psVar2,
      this_00 !=
      local_d0.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish; this_00 = this_00 + 1) {
    LogicalType::~LogicalType(this_00);
    psVar2 = local_170;
  }
  if (local_d0.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start != (LogicalType *)0x0) {
    operator_delete(local_d0.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                    .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  LogicalType::~LogicalType(&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  return psVar2;
}

Assistant:

const string AggregateStateType::GetTypeName(const LogicalType &type) {
	D_ASSERT(type.id() == LogicalTypeId::AGGREGATE_STATE);
	auto info = type.AuxInfo();
	if (!info) {
		return "AGGREGATE_STATE<?>";
	}
	auto aggr_state = info->Cast<AggregateStateTypeInfo>().state_type;
	return "AGGREGATE_STATE<" + aggr_state.function_name + "(" +
	       StringUtil::Join(aggr_state.bound_argument_types, aggr_state.bound_argument_types.size(), ", ",
	                        [](const LogicalType &arg_type) { return arg_type.ToString(); }) +
	       ")" + "::" + aggr_state.return_type.ToString() + ">";
}